

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(cmGeneratorTarget *this,string *config)

{
  pointer pcVar1;
  int iVar2;
  LinkClosure *pLVar3;
  cmValue cVar4;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string linkerIdVar;
  string ll;
  string local_a0;
  long *local_80;
  undefined8 local_78;
  long local_70 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  long *local_40;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  
  pLVar3 = GetLinkClosure(this,config);
  pcVar1 = (pLVar3->LinkerLanguage)._M_dataplus._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (pLVar3->LinkerLanguage)._M_string_length);
  local_60.first._M_len = 6;
  local_60.first._M_str = "CMAKE_";
  local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = local_78;
  local_40 = local_80;
  local_38 = 0;
  local_30 = 0x13;
  local_28 = "_COMPILER_LINKER_ID";
  local_20 = 0;
  views._M_len = 3;
  views._M_array = &local_60;
  cmCatViews(&local_a0,views);
  cVar4 = cmMakefile::GetDefinition(this->Makefile,&local_a0);
  if (cVar4.Value == (string *)0x0) {
    bVar5 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)cVar4.Value);
    if (iVar2 == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)cVar4.Value);
      bVar5 = iVar2 == 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(
  std::string const& config) const
{
  // FIXME(#25486): Account for the LINKER_TYPE target property.
  // Also factor out the hard-coded list below into a platform
  // information table based on the linker id.
  std::string ll = this->GetLinkerLanguage(config);
  std::string linkerIdVar = cmStrCat("CMAKE_", ll, "_COMPILER_LINKER_ID");
  cmValue linkerId = this->Makefile->GetDefinition(linkerIdVar);
  // The GNU bfd-based linker may enforce '--no-allow-shlib-undefined'
  // recursively by default.  The Solaris linker has similar behavior.
  return linkerId && (*linkerId == "GNU" || *linkerId == "Solaris");
}